

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

void __thiscall
gl4cts::SimpleQueriesTestCase::testSipmleQueries
          (SimpleQueriesTestCase *this,Functions *gl,GLint pname)

{
  bool bVar1;
  GLenum GVar2;
  ostream *poVar3;
  TestError *this_00;
  GLboolean value_bool;
  GLfloat value_float;
  GLint value_int;
  GLdouble value_double;
  GLint64 value_int64;
  stringstream log;
  GLboolean local_1d9;
  GLfloat local_1d8;
  GLint local_1d4;
  char *local_1d0;
  GLdouble local_1b0;
  GLint64 local_1a8;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Testing simple query for pname: ",0x20);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_190,pname);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," - ",3);
  (*gl->getIntegerv)(pname,&local_1d4);
  GVar2 = (*gl->getError)();
  bVar1 = SparseTextureUtils::verifyError((stringstream *)local_1a0,"getIntegerv",GVar2,0);
  if (bVar1) {
    (*gl->getInteger64v)(pname,&local_1a8);
    GVar2 = (*gl->getError)();
    bVar1 = SparseTextureUtils::verifyError((stringstream *)local_1a0,"getInteger64v",GVar2,0);
    if (bVar1) {
      (*gl->getFloatv)(pname,&local_1d8);
      GVar2 = (*gl->getError)();
      bVar1 = SparseTextureUtils::verifyError((stringstream *)local_1a0,"getFloatv",GVar2,0);
      if (bVar1) {
        (*gl->getDoublev)(pname,&local_1b0);
        GVar2 = (*gl->getError)();
        bVar1 = SparseTextureUtils::verifyError((stringstream *)local_1a0,"getDoublev",GVar2,0);
        if (bVar1) {
          (*gl->getBooleanv)(pname,&local_1d9);
          GVar2 = (*gl->getError)();
          bVar1 = SparseTextureUtils::verifyError((stringstream *)local_1a0,"getBooleanv",GVar2,0);
          if (bVar1) {
            std::__cxx11::stringstream::~stringstream(local_1a0);
            std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
            return;
          }
        }
      }
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  tcu::TestError::TestError
            (this_00,local_1d0,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
             ,0x3ed);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SimpleQueriesTestCase::testSipmleQueries(const Functions& gl, GLint pname)
{
	std::stringstream log;
	log << "Testing simple query for pname: " << pname << " - ";

	bool result = true;

	GLint	 value_int;
	GLint64   value_int64;
	GLfloat   value_float;
	GLdouble  value_double;
	GLboolean value_bool;

	gl.getIntegerv(pname, &value_int);
	result = SparseTextureUtils::verifyError(log, "getIntegerv", gl.getError(), GL_NO_ERROR);

	if (result)
	{
		gl.getInteger64v(pname, &value_int64);
		result = SparseTextureUtils::verifyError(log, "getInteger64v", gl.getError(), GL_NO_ERROR);

		if (result)
		{
			gl.getFloatv(pname, &value_float);
			result = SparseTextureUtils::verifyError(log, "getFloatv", gl.getError(), GL_NO_ERROR);

			if (result)
			{
				gl.getDoublev(pname, &value_double);
				result = SparseTextureUtils::verifyError(log, "getDoublev", gl.getError(), GL_NO_ERROR);

				if (result)
				{
					gl.getBooleanv(pname, &value_bool);
					result = SparseTextureUtils::verifyError(log, "getBooleanv", gl.getError(), GL_NO_ERROR);
				}
			}
		}
	}

	if (!result)
	{
		TCU_FAIL(log.str().c_str());
	}
}